

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_value.cpp
# Opt level: O1

void duckdb::UnionValueFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  char cVar1;
  Vector *pVVar2;
  long lVar3;
  
  pVVar2 = (Vector *)duckdb::UnionVector::GetMember(result,0);
  vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  duckdb::Vector::Reference(pVVar2);
  lVar3 = duckdb::UnionVector::GetTags(result);
  duckdb::Vector::SetVectorType((VectorType)lVar3);
  **(undefined1 **)(lVar3 + 0x20) = 0;
  cVar1 = duckdb::DataChunk::AllConstant();
  if (cVar1 != '\0') {
    duckdb::Vector::SetVectorType((VectorType)result);
  }
  duckdb::Vector::Verify((ulong)result);
  return;
}

Assistant:

static void UnionValueFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	// Assign the new entries to the result vector
	UnionVector::GetMember(result, 0).Reference(args.data[0]);

	// Set the result tag vector to a constant value
	auto &tag_vector = UnionVector::GetTags(result);
	tag_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
	ConstantVector::GetData<union_tag_t>(tag_vector)[0] = 0;

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	result.Verify(args.size());
}